

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToDOT.cpp
# Opt level: O3

void __thiscall
OpenMPToClause::generateDOT
          (OpenMPToClause *this,ofstream *dot_file,int depth,int index,string *parent_node)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  char *pcVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  long *plVar9;
  undefined8 *puVar10;
  size_t sVar11;
  long *plVar12;
  ulong *puVar13;
  size_type *psVar14;
  ulong uVar15;
  pointer ppcVar16;
  undefined8 uVar17;
  uint uVar18;
  uint uVar19;
  string __str_1;
  string __str;
  string __str_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_3;
  string mapper_identifier;
  string parameter_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string clause_kind;
  string indent;
  string current_line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ulong *local_1a8;
  long local_1a0;
  ulong local_198;
  undefined8 uStack_190;
  ofstream *local_188;
  long *local_180;
  long local_178;
  long local_170;
  long lStack_168;
  ulong *local_160;
  long local_158;
  ulong local_150;
  long lStack_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  allocator<char> local_f9;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  ulong *local_d8;
  long local_d0;
  ulong local_c8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  char *local_58;
  undefined8 local_50;
  char local_48;
  undefined7 uStack_47;
  OpenMPToClause *local_38;
  
  local_58 = &local_48;
  local_50 = 0;
  local_48 = '\0';
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_188 = dot_file;
  local_38 = this;
  std::__cxx11::string::_M_construct((ulong)&local_78,(char)depth);
  uVar19 = -depth;
  if (0 < depth) {
    uVar19 = depth;
  }
  uVar18 = 1;
  if (9 < uVar19) {
    uVar15 = (ulong)uVar19;
    uVar6 = 4;
    do {
      uVar18 = uVar6;
      uVar8 = (uint)uVar15;
      if (uVar8 < 100) {
        uVar18 = uVar18 - 2;
        goto LAB_001452b1;
      }
      if (uVar8 < 1000) {
        uVar18 = uVar18 - 1;
        goto LAB_001452b1;
      }
      if (uVar8 < 10000) goto LAB_001452b1;
      uVar15 = uVar15 / 10000;
      uVar6 = uVar18 + 4;
    } while (99999 < uVar8);
    uVar18 = uVar18 + 1;
  }
LAB_001452b1:
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_1e8,(char)uVar18 - (char)(depth >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_1e8._M_dataplus._M_p + ((uint)depth >> 0x1f),uVar18,uVar19);
  plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_1e8,0,(char *)0x0,0x1a5eb7);
  plVar12 = plVar9 + 2;
  if ((long *)*plVar9 == plVar12) {
    local_170 = *plVar12;
    lStack_168 = plVar9[3];
    local_180 = &local_170;
  }
  else {
    local_170 = *plVar12;
    local_180 = (long *)*plVar9;
  }
  local_178 = plVar9[1];
  *plVar9 = (long)plVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_180);
  puVar13 = (ulong *)(plVar9 + 2);
  if ((ulong *)*plVar9 == puVar13) {
    local_150 = *puVar13;
    lStack_148 = plVar9[3];
    local_160 = &local_150;
  }
  else {
    local_150 = *puVar13;
    local_160 = (ulong *)*plVar9;
  }
  local_158 = plVar9[1];
  *plVar9 = (long)puVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  uVar19 = -index;
  if (0 < index) {
    uVar19 = index;
  }
  uVar18 = 1;
  if (9 < uVar19) {
    uVar15 = (ulong)uVar19;
    uVar6 = 4;
    do {
      uVar18 = uVar6;
      uVar8 = (uint)uVar15;
      if (uVar8 < 100) {
        uVar18 = uVar18 - 2;
        goto LAB_00145413;
      }
      if (uVar8 < 1000) {
        uVar18 = uVar18 - 1;
        goto LAB_00145413;
      }
      if (uVar8 < 10000) goto LAB_00145413;
      uVar15 = uVar15 / 10000;
      uVar6 = uVar18 + 4;
    } while (99999 < uVar8);
    uVar18 = uVar18 + 1;
  }
LAB_00145413:
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_208,(char)uVar18 - (char)(index >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_208._M_dataplus._M_p + ((uint)index >> 0x1f),uVar18,uVar19);
  uVar15 = 0xf;
  if (local_160 != &local_150) {
    uVar15 = local_150;
  }
  paVar1 = &local_1e8.field_2;
  paVar2 = &local_208.field_2;
  if (uVar15 < local_208._M_string_length + local_158) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar2) {
      uVar17 = local_208.field_2._M_allocated_capacity;
    }
    if (local_208._M_string_length + local_158 <= (ulong)uVar17) {
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,(ulong)local_160);
      goto LAB_001454af;
    }
  }
  puVar10 = (undefined8 *)
            std::__cxx11::string::_M_append((char *)&local_160,(ulong)local_208._M_dataplus._M_p);
LAB_001454af:
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  psVar14 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar14) {
    local_b8.field_2._M_allocated_capacity = *psVar14;
    local_b8.field_2._8_8_ = puVar10[3];
  }
  else {
    local_b8.field_2._M_allocated_capacity = *psVar14;
    local_b8._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_b8._M_string_length = puVar10[1];
  *puVar10 = psVar14;
  puVar10[1] = 0;
  *(undefined1 *)psVar14 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if (local_160 != &local_150) {
    operator_delete(local_160,local_150 + 1);
  }
  if (local_180 != &local_170) {
    operator_delete(local_180,local_170 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_208,&local_78,parent_node);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_208);
  puVar13 = (ulong *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13) {
    local_1e8.field_2._M_allocated_capacity = *puVar13;
    local_1e8.field_2._8_8_ = plVar9[3];
    local_1e8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1e8.field_2._M_allocated_capacity = *puVar13;
    local_1e8._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_1e8._M_string_length = plVar9[1];
  *plVar9 = (long)puVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_1e8,(ulong)local_b8._M_dataplus._M_p);
  plVar12 = plVar9 + 2;
  if ((long *)*plVar9 == plVar12) {
    local_170 = *plVar12;
    lStack_168 = plVar9[3];
    local_180 = &local_170;
  }
  else {
    local_170 = *plVar12;
    local_180 = (long *)*plVar9;
  }
  local_178 = plVar9[1];
  *plVar9 = (long)plVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_180);
  puVar13 = (ulong *)(plVar9 + 2);
  if ((ulong *)*plVar9 == puVar13) {
    local_150 = *puVar13;
    lStack_148 = plVar9[3];
    local_160 = &local_150;
  }
  else {
    local_150 = *puVar13;
    local_160 = (ulong *)*plVar9;
  }
  local_158 = plVar9[1];
  *plVar9 = (long)puVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_58,(string *)&local_160);
  if (local_160 != &local_150) {
    operator_delete(local_160,local_150 + 1);
  }
  if (local_180 != &local_170) {
    operator_delete(local_180,local_170 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  pcVar5 = local_58;
  if (local_58 == (char *)0x0) {
    std::ios::clear((int)local_188 + (int)*(undefined8 *)(*(long *)local_188 + -0x18));
  }
  else {
    sVar11 = strlen(local_58);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,pcVar5,sVar11);
  }
  std::__cxx11::string::append((char *)&local_78);
  local_158 = 0;
  local_150 = local_150 & 0xffffffffffffff00;
  local_160 = &local_150;
  if ((local_38->to_kind == OMPC_TO_mapper) &&
     (std::__cxx11::string::_M_replace((ulong)&local_160,0,(char *)0x0,0x1a79e4), local_158 != 0)) {
    local_180 = &local_170;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_180,local_b8._M_dataplus._M_p,
               local_b8._M_dataplus._M_p + local_b8._M_string_length);
    std::__cxx11::string::append((char *)&local_180);
    std::operator+(&local_1c8,&local_78,&local_b8);
    puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
    puVar13 = puVar10 + 2;
    if ((ulong *)*puVar10 == puVar13) {
      local_198 = *puVar13;
      uStack_190 = puVar10[3];
      local_1a8 = &local_198;
    }
    else {
      local_198 = *puVar13;
      local_1a8 = (ulong *)*puVar10;
    }
    local_1a0 = puVar10[1];
    *puVar10 = puVar13;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_180);
    psVar14 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_208.field_2._M_allocated_capacity = *psVar14;
      local_208.field_2._8_8_ = plVar9[3];
      local_208._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_208.field_2._M_allocated_capacity = *psVar14;
      local_208._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_208._M_string_length = plVar9[1];
    *plVar9 = (long)psVar14;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_208);
    psVar14 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_1e8.field_2._M_allocated_capacity = *psVar14;
      local_1e8.field_2._8_8_ = plVar9[3];
      local_1e8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_1e8.field_2._M_allocated_capacity = *psVar14;
      local_1e8._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_1e8._M_string_length = plVar9[1];
    *plVar9 = (long)psVar14;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_58,(string *)&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    paVar1 = &local_1c8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    pcVar5 = local_58;
    if (local_58 == (char *)0x0) {
      std::ios::clear((int)local_188 + (int)*(undefined8 *)(*(long *)local_188 + -0x18));
    }
    else {
      sVar11 = strlen(local_58);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,pcVar5,sVar11);
    }
    local_f8 = &local_e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,local_78._M_dataplus._M_p,
               local_78._M_dataplus._M_p + local_78._M_string_length);
    std::__cxx11::string::append((char *)&local_f8);
    plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_180);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    psVar14 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_120.field_2._M_allocated_capacity = *psVar14;
      local_120.field_2._8_8_ = plVar9[3];
    }
    else {
      local_120.field_2._M_allocated_capacity = *psVar14;
      local_120._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_120._M_string_length = plVar9[1];
    *plVar9 = (long)psVar14;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_120);
    psVar14 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_140.field_2._M_allocated_capacity = *psVar14;
      local_140.field_2._8_8_ = plVar9[3];
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    }
    else {
      local_140.field_2._M_allocated_capacity = *psVar14;
      local_140._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_140._M_string_length = plVar9[1];
    *plVar9 = (long)psVar14;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_180);
    puVar13 = (ulong *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar13) {
      local_1c8.field_2._M_allocated_capacity = *puVar13;
      local_1c8.field_2._8_8_ = plVar9[3];
      local_1c8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_1c8.field_2._M_allocated_capacity = *puVar13;
      local_1c8._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_1c8._M_string_length = plVar9[1];
    *plVar9 = (long)puVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
    puVar13 = puVar10 + 2;
    if ((ulong *)*puVar10 == puVar13) {
      local_198 = *puVar13;
      uStack_190 = puVar10[3];
      local_1a8 = &local_198;
    }
    else {
      local_198 = *puVar13;
      local_1a8 = (ulong *)*puVar10;
    }
    local_1a0 = puVar10[1];
    *puVar10 = puVar13;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_160);
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    puVar13 = (ulong *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar13) {
      local_208.field_2._M_allocated_capacity = *puVar13;
      local_208.field_2._8_8_ = plVar9[3];
    }
    else {
      local_208.field_2._M_allocated_capacity = *puVar13;
      local_208._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_208._M_string_length = plVar9[1];
    *plVar9 = (long)puVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_208);
    puVar13 = (ulong *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar13) {
      local_1e8.field_2._M_allocated_capacity = *puVar13;
      local_1e8.field_2._8_8_ = plVar9[3];
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    }
    else {
      local_1e8.field_2._M_allocated_capacity = *puVar13;
      local_1e8._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_1e8._M_string_length = plVar9[1];
    *plVar9 = (long)puVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_58,(string *)&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if (local_f8 != &local_e8) {
      operator_delete(local_f8,local_e8 + 1);
    }
    pcVar5 = local_58;
    if (local_58 == (char *)0x0) {
      std::ios::clear((int)local_188 + (int)*(undefined8 *)(*(long *)local_188 + -0x18));
    }
    else {
      sVar11 = strlen(local_58);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,pcVar5,sVar11);
    }
    if (local_180 != &local_170) {
      operator_delete(local_180,local_170 + 1);
    }
  }
  local_180 = &local_170;
  pcVar4 = (local_38->mapper_identifier)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_180,pcVar4,pcVar4 + (local_38->mapper_identifier)._M_string_length);
  iVar7 = std::__cxx11::string::compare((char *)&local_180);
  if (iVar7 != 0) {
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1e8,local_b8._M_dataplus._M_p,
               local_b8._M_dataplus._M_p + local_b8._M_string_length);
    std::__cxx11::string::append((char *)&local_1e8);
    std::__cxx11::string::_M_assign((string *)&local_160);
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_208,local_b8._M_dataplus._M_p,
               local_b8._M_dataplus._M_p + local_b8._M_string_length);
    std::__cxx11::string::append((char *)&local_208);
    std::operator+(&local_120,&local_78,&local_1e8);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_120);
    paVar1 = &local_140.field_2;
    psVar14 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_140.field_2._M_allocated_capacity = *psVar14;
      local_140.field_2._8_8_ = plVar9[3];
      local_140._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_140.field_2._M_allocated_capacity = *psVar14;
      local_140._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_140._M_string_length = plVar9[1];
    *plVar9 = (long)psVar14;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_140,(ulong)local_208._M_dataplus._M_p);
    paVar2 = &local_1c8.field_2;
    psVar14 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_1c8.field_2._M_allocated_capacity = *psVar14;
      local_1c8.field_2._8_8_ = plVar9[3];
      local_1c8._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_1c8.field_2._M_allocated_capacity = *psVar14;
      local_1c8._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_1c8._M_string_length = plVar9[1];
    *plVar9 = (long)psVar14;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
    puVar13 = puVar10 + 2;
    if ((ulong *)*puVar10 == puVar13) {
      local_198 = *puVar13;
      uStack_190 = puVar10[3];
      local_1a8 = &local_198;
    }
    else {
      local_198 = *puVar13;
      local_1a8 = (ulong *)*puVar10;
    }
    local_1a0 = puVar10[1];
    *puVar10 = puVar13;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_58,(string *)&local_1a8);
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    paVar3 = &local_120.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar3) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    pcVar5 = local_58;
    if (local_58 == (char *)0x0) {
      std::ios::clear((int)local_188 + (int)*(undefined8 *)(*(long *)local_188 + -0x18));
    }
    else {
      sVar11 = strlen(local_58);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,pcVar5,sVar11);
    }
    local_d8 = local_c8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d8,local_78._M_dataplus._M_p,
               local_78._M_dataplus._M_p + local_78._M_string_length);
    std::__cxx11::string::append((char *)&local_d8);
    plVar9 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_d8,(ulong)local_208._M_dataplus._M_p);
    local_98 = &local_88;
    plVar12 = plVar9 + 2;
    if ((long *)*plVar9 == plVar12) {
      local_88 = *plVar12;
      lStack_80 = plVar9[3];
    }
    else {
      local_88 = *plVar12;
      local_98 = (long *)*plVar9;
    }
    local_90 = plVar9[1];
    *plVar9 = (long)plVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_98);
    plVar12 = plVar9 + 2;
    if ((long *)*plVar9 == plVar12) {
      local_e8 = *plVar12;
      lStack_e0 = plVar9[3];
      local_f8 = &local_e8;
    }
    else {
      local_e8 = *plVar12;
      local_f8 = (long *)*plVar9;
    }
    local_f0 = plVar9[1];
    *plVar9 = (long)plVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_f8,(ulong)local_208._M_dataplus._M_p);
    psVar14 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_120.field_2._M_allocated_capacity = *psVar14;
      local_120.field_2._8_8_ = plVar9[3];
      local_120._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_120.field_2._M_allocated_capacity = *psVar14;
      local_120._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_120._M_string_length = plVar9[1];
    *plVar9 = (long)psVar14;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_120);
    psVar14 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_140.field_2._M_allocated_capacity = *psVar14;
      local_140.field_2._8_8_ = plVar9[3];
      local_140._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_140.field_2._M_allocated_capacity = *psVar14;
      local_140._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_140._M_string_length = plVar9[1];
    *plVar9 = (long)psVar14;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_160);
    puVar13 = (ulong *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar13) {
      local_1c8.field_2._M_allocated_capacity = *puVar13;
      local_1c8.field_2._8_8_ = plVar9[3];
      local_1c8._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_1c8.field_2._M_allocated_capacity = *puVar13;
      local_1c8._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_1c8._M_string_length = plVar9[1];
    *plVar9 = (long)puVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
    puVar13 = puVar10 + 2;
    if ((ulong *)*puVar10 == puVar13) {
      local_198 = *puVar13;
      uStack_190 = puVar10[3];
      local_1a8 = &local_198;
    }
    else {
      local_198 = *puVar13;
      local_1a8 = (ulong *)*puVar10;
    }
    local_1a0 = puVar10[1];
    *puVar10 = puVar13;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_58,(string *)&local_1a8);
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar3) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if (local_f8 != &local_e8) {
      operator_delete(local_f8,local_e8 + 1);
    }
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    if (local_d8 != local_c8) {
      operator_delete(local_d8,local_c8[0] + 1);
    }
    pcVar5 = local_58;
    if (local_58 == (char *)0x0) {
      std::ios::clear((int)local_188 + (int)*(undefined8 *)(*(long *)local_188 + -0x18));
    }
    else {
      sVar11 = strlen(local_58);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,pcVar5,sVar11);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
  }
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_allocated_capacity =
       local_1e8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  ppcVar16 = (local_38->super_OpenMPClause).expressions.
             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppcVar16 !=
      (local_38->super_OpenMPClause).expressions.
      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    paVar1 = &local_1c8.field_2;
    uVar19 = 0;
    do {
      local_1a8 = &local_198;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1a8,local_b8._M_dataplus._M_p,
                 local_b8._M_dataplus._M_p + local_b8._M_string_length);
      std::__cxx11::string::append((char *)&local_1a8);
      uVar18 = 1;
      if (9 < uVar19) {
        uVar15 = (ulong)uVar19;
        uVar6 = 4;
        do {
          uVar18 = uVar6;
          uVar8 = (uint)uVar15;
          if (uVar8 < 100) {
            uVar18 = uVar18 - 2;
            goto LAB_001464d8;
          }
          if (uVar8 < 1000) {
            uVar18 = uVar18 - 1;
            goto LAB_001464d8;
          }
          if (uVar8 < 10000) goto LAB_001464d8;
          uVar15 = uVar15 / 10000;
          uVar6 = uVar18 + 4;
        } while (99999 < uVar8);
        uVar18 = uVar18 + 1;
      }
LAB_001464d8:
      local_1c8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct((ulong)&local_1c8,(char)uVar18);
      std::__detail::__to_chars_10_impl<unsigned_int>(local_1c8._M_dataplus._M_p,uVar18,uVar19);
      uVar15 = 0xf;
      if (local_1a8 != &local_198) {
        uVar15 = local_198;
      }
      paVar2 = &local_208.field_2;
      if (uVar15 < local_1c8._M_string_length + local_1a0) {
        uVar17 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != paVar1) {
          uVar17 = local_1c8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar17 < local_1c8._M_string_length + local_1a0) goto LAB_00146542;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,(ulong)local_1a8);
      }
      else {
LAB_00146542:
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_1a8,(ulong)local_1c8._M_dataplus._M_p);
      }
      psVar14 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_208.field_2._M_allocated_capacity = *psVar14;
        local_208.field_2._8_8_ = puVar10[3];
        local_208._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_208.field_2._M_allocated_capacity = *psVar14;
        local_208._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_208._M_string_length = puVar10[1];
      *puVar10 = psVar14;
      puVar10[1] = 0;
      *(undefined1 *)psVar14 = 0;
      std::__cxx11::string::operator=((string *)&local_1e8,(string *)&local_208);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != paVar2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      std::operator+(&local_140,&local_78,&local_b8);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_140);
      psVar14 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_1c8.field_2._M_allocated_capacity = *psVar14;
        local_1c8.field_2._8_8_ = plVar9[3];
        local_1c8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_1c8.field_2._M_allocated_capacity = *psVar14;
        local_1c8._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_1c8._M_string_length = plVar9[1];
      *plVar9 = (long)psVar14;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      puVar10 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_1c8,(ulong)local_1e8._M_dataplus._M_p);
      puVar13 = puVar10 + 2;
      if ((ulong *)*puVar10 == puVar13) {
        local_198 = *puVar13;
        uStack_190 = puVar10[3];
        local_1a8 = &local_198;
      }
      else {
        local_198 = *puVar13;
        local_1a8 = (ulong *)*puVar10;
      }
      local_1a0 = puVar10[1];
      *puVar10 = puVar13;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_1a8);
      psVar14 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_208.field_2._M_allocated_capacity = *psVar14;
        local_208.field_2._8_8_ = plVar9[3];
        local_208._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_208.field_2._M_allocated_capacity = *psVar14;
        local_208._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_208._M_string_length = plVar9[1];
      *plVar9 = (long)psVar14;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_58,(string *)&local_208);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != paVar2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      pcVar5 = local_58;
      if (local_58 == (char *)0x0) {
        std::ios::clear((int)local_188 + (int)*(undefined8 *)(*(long *)local_188 + -0x18));
      }
      else {
        sVar11 = strlen(local_58);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,pcVar5,sVar11);
      }
      local_98 = &local_88;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,local_78._M_dataplus._M_p,
                 local_78._M_dataplus._M_p + local_78._M_string_length);
      std::__cxx11::string::append((char *)&local_98);
      plVar9 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_98,(ulong)local_1e8._M_dataplus._M_p);
      local_f8 = &local_e8;
      plVar12 = plVar9 + 2;
      if ((long *)*plVar9 == plVar12) {
        local_e8 = *plVar12;
        lStack_e0 = plVar9[3];
      }
      else {
        local_e8 = *plVar12;
        local_f8 = (long *)*plVar9;
      }
      local_f0 = plVar9[1];
      *plVar9 = (long)plVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_f8);
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      psVar14 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_120.field_2._M_allocated_capacity = *psVar14;
        local_120.field_2._8_8_ = plVar9[3];
      }
      else {
        local_120.field_2._M_allocated_capacity = *psVar14;
        local_120._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_120._M_string_length = plVar9[1];
      *plVar9 = (long)psVar14;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_120,(ulong)local_1e8._M_dataplus._M_p);
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      psVar14 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_140.field_2._M_allocated_capacity = *psVar14;
        local_140.field_2._8_8_ = plVar9[3];
      }
      else {
        local_140.field_2._M_allocated_capacity = *psVar14;
        local_140._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_140._M_string_length = plVar9[1];
      *plVar9 = (long)psVar14;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_140);
      puVar13 = (ulong *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar13) {
        local_1c8.field_2._M_allocated_capacity = *puVar13;
        local_1c8.field_2._8_8_ = plVar9[3];
        local_1c8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_1c8.field_2._M_allocated_capacity = *puVar13;
        local_1c8._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_1c8._M_string_length = plVar9[1];
      *plVar9 = (long)puVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,*ppcVar16,&local_f9);
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != paVar1) {
        uVar17 = local_1c8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar17 < local_d0 + local_1c8._M_string_length) {
        uVar15 = 0xf;
        if (local_d8 != local_c8) {
          uVar15 = local_c8[0];
        }
        if (uVar15 < local_d0 + local_1c8._M_string_length) goto LAB_00146a0f;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_d8,0,(char *)0x0,(ulong)local_1c8._M_dataplus._M_p);
      }
      else {
LAB_00146a0f:
        puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)local_d8);
      }
      puVar13 = puVar10 + 2;
      if ((ulong *)*puVar10 == puVar13) {
        local_198 = *puVar13;
        uStack_190 = puVar10[3];
        local_1a8 = &local_198;
      }
      else {
        local_198 = *puVar13;
        local_1a8 = (ulong *)*puVar10;
      }
      local_1a0 = puVar10[1];
      *puVar10 = puVar13;
      puVar10[1] = 0;
      *(undefined1 *)puVar13 = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_1a8);
      puVar13 = (ulong *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar13) {
        local_208.field_2._M_allocated_capacity = *puVar13;
        local_208.field_2._8_8_ = plVar9[3];
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      }
      else {
        local_208.field_2._M_allocated_capacity = *puVar13;
        local_208._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_208._M_string_length = plVar9[1];
      *plVar9 = (long)puVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_58,(string *)&local_208);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      if (local_d8 != local_c8) {
        operator_delete(local_d8,local_c8[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,local_e8 + 1);
      }
      if (local_98 != &local_88) {
        operator_delete(local_98,local_88 + 1);
      }
      pcVar5 = local_58;
      if (local_58 == (char *)0x0) {
        std::ios::clear((int)local_188 + (int)*(undefined8 *)(*(long *)local_188 + -0x18));
      }
      else {
        sVar11 = strlen(local_58);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,pcVar5,sVar11);
      }
      uVar19 = uVar19 + 1;
      ppcVar16 = ppcVar16 + 1;
    } while (ppcVar16 !=
             (local_38->super_OpenMPClause).expressions.
             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_180 != &local_170) {
    operator_delete(local_180,local_170 + 1);
  }
  if (local_160 != &local_150) {
    operator_delete(local_160,local_150 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
  }
  return;
}

Assistant:

void OpenMPToClause::generateDOT(std::ofstream& dot_file, int depth, int index, std::string parent_node) {

    std::string current_line;
    std::string indent = std::string(depth, '\t');

    std::string clause_kind = "to_" + std::to_string(depth) + "_" + std::to_string(index);
    current_line = indent + parent_node + "-- " + clause_kind + "\n";
    dot_file << current_line.c_str();
    indent += "\t";
    OpenMPToClauseKind kind = this->getKind();
    std::string parameter_string;
    switch (kind) {
        case OMPC_TO_mapper:
            parameter_string = "mapper";
            break;
        default:
            ;
    };

    if (parameter_string.size() > 0) {
        std::string node_id = clause_kind + "_kind";
        current_line = indent + clause_kind + " -- " + node_id + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + node_id + " [label = \"" + node_id + "\\n " + parameter_string + "\"]\n";
        dot_file << current_line.c_str();
    };
    std::string mapper_identifier = this->getMapperIdentifier();
    if (mapper_identifier != "") {
    std::string node_id =  clause_kind+ "_kind";
        parameter_string = mapper_identifier;
        std::string mapper_identifier_name = clause_kind + "_mapper_identifier";
        current_line = indent + node_id + " -- " + mapper_identifier_name + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + mapper_identifier_name + " [label = \"" + mapper_identifier_name + "\\n " + parameter_string + "\"]\n";
        dot_file << current_line.c_str();
    };    


 std::vector<const char*>* expr = this->getExpressions();
    if (expr != NULL) {
        std::vector<const char*>::iterator it;
        int expr_index = 0;
        std::string expr_name;
        for (it = expr->begin(); it != expr->end(); it++) {
            expr_name = clause_kind + "_expr" + std::to_string(expr_index);
            expr_index += 1;
            current_line = indent + clause_kind + " -- " + expr_name + "\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t" + expr_name + " [label = \"" + expr_name + "\\n " + std::string(*it) + "\"]\n";
            dot_file << current_line.c_str();
        };
    };

}